

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

void __thiscall
cmGeneratedFileStream::WriteAltEncoding(cmGeneratedFileStream *this,string *data,Encoding encoding)

{
  codecvt *this_00;
  locale prevLocale;
  locale lStack_48;
  locale local_40;
  locale local_38;
  locale local_30;
  
  std::locale::locale(&lStack_48,
                      (locale *)
                      (&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                        field_0xd0 +
                      (long)(this->super_ofstream).
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                            [-3]));
  this_00 = (codecvt *)operator_new(0x20);
  codecvt::codecvt(this_00,encoding);
  std::locale::locale<codecvt>(&local_40,&lStack_48,this_00);
  std::ios::imbue(&local_38);
  std::locale::~locale(&local_40);
  std::locale::~locale(&lStack_48);
  std::ostream::write((char *)this,(long)(data->_M_dataplus)._M_p);
  std::ios::imbue(&local_30);
  std::locale::~locale(&local_30);
  std::locale::~locale(&local_38);
  return;
}

Assistant:

void cmGeneratedFileStream::WriteAltEncoding(std::string const& data,
                                             Encoding encoding)
{
#ifndef CMAKE_BOOTSTRAP
  std::locale prevLocale =
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  this->write(data.data(), data.size());
  this->imbue(prevLocale);
#else
  static_cast<void>(encoding);
  this->write(data.data(), data.size());
#endif
}